

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

size_t skip_sep(LexState *ls)

{
  size_t sVar1;
  uint c;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  c = ls->current;
  if ((c != 0x5b) && (c != 0x5d)) {
    __assert_fail("s == \'[\' || s == \']\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                  ,0x119,"size_t skip_sep(LexState *)");
  }
  save(ls,c);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  lVar6 = 0;
  while (uVar4 == 0x3d) {
    save(ls,0x3d);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    lVar6 = lVar6 + 1;
  }
  uVar5 = (ulong)(lVar6 == 0);
  if (uVar4 == c) {
    uVar5 = lVar6 + 2;
  }
  return uVar5;
}

Assistant:

static size_t skip_sep (LexState *ls) {
  size_t count = 0;
  int s = ls->current;
  lua_assert(s == '[' || s == ']');
  save_and_next(ls);
  while (ls->current == '=') {
    save_and_next(ls);
    count++;
  }
  return (ls->current == s) ? count + 2
         : (count == 0) ? 1
         : 0;
}